

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,_testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  _Alloc_hider type_param;
  bool bVar5;
  undefined1 uVar6;
  undefined1 extraout_AL;
  int iVar7;
  char *pcVar8;
  const_iterator cVar9;
  CodeLocation *pCVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_t sVar13;
  TestFactoryBase *pTVar14;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong *puVar16;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  ulong uVar17;
  char *pcVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  char *pcVar20;
  CodeLocation *pCVar21;
  type_info *ptVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  undefined1 *puVar24;
  size_type __dnew;
  string test_name;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a0;
  pointer local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  int local_380;
  string local_378;
  GTestLog local_354;
  string local_350;
  int local_330;
  string local_328;
  CodeLocation local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  pointer local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  uint local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  pointer local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  int local_298;
  string local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  pointer local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  uint local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  pointer local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  allocator<char> local_228;
  allocator<char> local_227;
  allocator<char> local_226;
  allocator<char> local_225;
  allocator<char> local_224;
  allocator<char> local_223;
  allocator<char> local_222;
  allocator<char> local_221;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  pointer local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  int local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  CodeLocation *local_1d8;
  TypedTestSuitePState *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  pointer local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_1a8;
  string local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  pointer local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  uint local_160;
  key_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  CodeLocation *local_f8;
  size_type local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  key_type local_b0;
  undefined1 local_90 [17];
  undefined7 uStack_7f;
  undefined8 uStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_1d0 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
  pcVar8 = strchr((char *)code_location,0x2c);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,(char *)code_location,&local_228);
  }
  else {
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,code_location,pcVar8);
  }
  local_158._M_dataplus._M_p = (pointer)local_138;
  if (local_130 != 0) {
    pcVar8 = local_138->_M_local_buf + local_130;
    do {
      paVar19 = local_138;
      iVar7 = isspace((uint)(byte)pcVar8[-1]);
      local_158._M_dataplus._M_p = (pointer)paVar19;
      if (iVar7 == 0) break;
      pcVar18 = pcVar8 + -1;
      uVar17 = (long)pcVar18 - (long)paVar19;
      std::__cxx11::string::_M_erase((ulong)&local_138,uVar17);
      pcVar8 = local_138->_M_local_buf + uVar17;
      local_158._M_dataplus._M_p = (pointer)local_138;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar18 != paVar19);
  }
  local_138 = &local_128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == local_138) {
    local_158.field_2._8_8_ = local_128._8_8_;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  local_158.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_158.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_158._M_string_length = local_130;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                  *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                 &local_158);
  iVar7 = 0x6f4130;
  if (cVar9._M_node ==
      (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10)) {
    FormatFileLocation_abi_cxx11_
              (&local_308.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x6f4130
              );
    TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
    ::Register();
LAB_0040610c:
    FormatFileLocation_abi_cxx11_
              (&local_308.file,(internal *)local_180->_M_local_buf,(char *)(ulong)local_160,iVar7);
    TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
    ::Register();
  }
  else {
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                         &local_158);
    local_1c8 = &local_1b8;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_1a8 = pCVar10->line;
    local_220 = &local_210;
    local_308.file._M_dataplus._M_p = (pointer)0x16;
    local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_220,(ulong)&local_308);
    local_210._M_allocated_capacity = (size_type)local_308.file._M_dataplus._M_p;
    local_220->_M_allocated_capacity = 0x6543796669726556;
    (&local_220->_M_allocated_capacity)[1] = 0x7461636966697472;
    *(char *)((long)local_220 + 0xe) = 'a';
    *(char *)((long)local_220 + 0xf) = 't';
    *(char *)((long)local_220 + 0x10) = 'e';
    *(char *)((long)local_220 + 0x11) = 'C';
    *(char *)((long)local_220 + 0x12) = 'h';
    *(char *)((long)local_220 + 0x13) = 'a';
    *(char *)((long)local_220 + 0x14) = 'i';
    *(char *)((long)local_220 + 0x15) = 'n';
    local_218 = local_308.file._M_dataplus._M_p;
    local_220->_M_local_buf[(long)local_308.file._M_dataplus._M_p] = '\0';
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_2e0 = &local_2d0;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar19) {
      local_2d0._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2d0._8_8_ = plVar11[3];
    }
    else {
      local_2d0._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2d8 = (pointer)plVar11[1];
    *plVar11 = (long)paVar19;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
    local_2b8 = &local_2a8;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == paVar19) {
      local_2a8._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2a8._8_8_ = puVar12[3];
    }
    else {
      local_2a8._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12;
    }
    local_2b0 = (pointer)puVar12[1];
    *puVar12 = paVar19;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_3a0 = &local_390;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar19) {
      local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_390._8_8_ = plVar11[3];
    }
    else {
      local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_398 = (pointer)plVar11[1];
    *plVar11 = (long)paVar19;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_350.field_2._M_allocated_capacity = *puVar16;
      local_350.field_2._8_8_ = plVar11[3];
    }
    else {
      local_350.field_2._M_allocated_capacity = *puVar16;
      local_350._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_350._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar8 = strchr((char *)code_location,0x2c);
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,(char *)code_location,&local_227);
    }
    else {
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,code_location,pcVar8);
    }
    local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p;
    if ((pointer)local_378._M_string_length != (pointer)0x0) {
      pcVar8 = (char *)(local_378._M_string_length + (long)local_378._M_dataplus._M_p);
      do {
        _Var15._M_p = local_378._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pcVar8[-1]);
        local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var15._M_p;
        if (iVar7 == 0) break;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar8 + -1);
        uVar17 = (long)paVar19 - (long)_Var15._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_378,uVar17);
        pcVar8 = local_378._M_dataplus._M_p + uVar17;
        local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._M_dataplus._M_p;
      } while (paVar19 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var15._M_p);
    }
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    if (local_270 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p) {
      local_260._8_8_ = local_378.field_2._8_8_;
      local_270 = &local_260;
    }
    paVar19 = local_270;
    local_260._M_allocated_capacity = local_378.field_2._M_allocated_capacity;
    local_268 = (pointer)local_378._M_string_length;
    local_378._M_string_length = 0;
    local_378.field_2._M_allocated_capacity =
         local_378.field_2._M_allocated_capacity & 0xffffffffffffff00;
    GetTypeName_abi_cxx11_
              (&local_328,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
               (type_info *)local_378._M_dataplus._M_p);
    _Var15._M_p = local_328._M_dataplus._M_p;
    local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
    local_1d8 = code_location;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_1c8,local_1c0 + (long)local_1c8);
    iVar7 = local_1a8;
    paVar23 = local_1c8;
    local_308.line = local_1a8;
    bVar5 = IsTrue(true);
    if (!bVar5) {
      GTestLog::GTestLog((GTestLog *)&local_290,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar23 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar23->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar23->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_290);
    }
    iVar7 = local_1a8;
    paVar23 = local_1c8;
    bVar5 = IsTrue(true);
    if (!bVar5) {
      GTestLog::GTestLog((GTestLog *)&local_290,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar23 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar23->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar23->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_290);
    }
    pTVar14 = (TestFactoryBase *)operator_new(8);
    pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006dd8b8;
    MakeAndRegisterTestInfo
              (&local_350,paVar19->_M_local_buf,_Var15._M_p,(char *)0x0,&local_308,
               &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
      operator_delete(local_308.file._M_dataplus._M_p,
                      local_308.file.field_2._M_allocated_capacity + 1);
    }
    pCVar10 = local_1d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,(ulong)(local_260._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,(ulong)(local_2d0._M_allocated_capacity + 1));
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210._M_allocated_capacity + 1);
    }
    if (local_1c8 == &local_1b8) {
      local_390._8_8_ = local_1b8._8_8_;
      local_3a0 = &local_390;
    }
    else {
      local_3a0 = local_1c8;
    }
    local_390._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_;
    local_390._M_local_buf[0] = local_1b8._M_local_buf[0];
    local_398 = local_1c0;
    local_1c0 = (pointer)0x0;
    local_1b8._M_local_buf[0] = '\0';
    local_380 = local_1a8;
    local_1c8 = &local_1b8;
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    local_180 = &local_170;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(prefix + 0x10);
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)prefix == paVar19) {
      local_170._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_170._8_8_ = *(undefined8 *)(prefix + 0x18);
    }
    else {
      local_170._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_180 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)prefix;
    }
    local_178 = *(pointer *)(prefix + 8);
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)prefix = paVar19;
    prefix[8] = '\0';
    prefix[9] = '\0';
    prefix[10] = '\0';
    prefix[0xb] = '\0';
    prefix[0xc] = '\0';
    prefix[0xd] = '\0';
    prefix[0xe] = '\0';
    prefix[0xf] = '\0';
    prefix[0x10] = '\0';
    local_160 = *(uint *)(prefix + 0x20);
    pcVar8 = strchr((char *)pCVar10,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
    pcVar18 = strchr(pcVar8,0x2c);
    if (pcVar18 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar8,&local_226);
    }
    else {
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar8,pcVar18);
    }
    local_b0._M_dataplus._M_p = (pointer)local_118;
    if (local_110 != 0) {
      pcVar18 = local_118->_M_local_buf + local_110;
      do {
        paVar19 = local_118;
        iVar7 = isspace((uint)(byte)pcVar18[-1]);
        local_b0._M_dataplus._M_p = (pointer)paVar19;
        if (iVar7 == 0) break;
        pcVar20 = pcVar18 + -1;
        uVar17 = (long)pcVar20 - (long)paVar19;
        std::__cxx11::string::_M_erase((ulong)&local_118,uVar17);
        pcVar18 = local_118->_M_local_buf + uVar17;
        local_b0._M_dataplus._M_p = (pointer)local_118;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar20 != paVar19);
    }
    local_118 = &local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == local_118) {
      local_b0.field_2._8_8_ = local_108._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_108._M_local_buf[0];
    local_b0._M_string_length = local_110;
    local_110 = 0;
    local_108._M_local_buf[0] = '\0';
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                   &local_b0);
    iVar7 = 0x6f4130;
    if (cVar9._M_node ==
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10))
    goto LAB_0040610c;
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                         &local_b0);
    local_220 = &local_210;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_200 = pCVar10->line;
    local_270 = &local_260;
    local_308.file._M_dataplus._M_p = (pointer)0x16;
    local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_308);
    local_260._M_allocated_capacity = (size_type)local_308.file._M_dataplus._M_p;
    local_270->_M_allocated_capacity = 0x6543796669726556;
    *(char *)((long)local_270 + 8) = 'r';
    *(char *)((long)local_270 + 9) = 't';
    *(char *)((long)local_270 + 10) = 'i';
    *(char *)((long)local_270 + 0xb) = 'f';
    *(char *)((long)local_270 + 0xc) = 'i';
    *(char *)((long)local_270 + 0xd) = 'c';
    *(char *)((long)local_270 + 0xe) = 'a';
    *(char *)((long)local_270 + 0xf) = 't';
    *(char *)((long)local_270 + 0xe) = 'a';
    *(char *)((long)local_270 + 0xf) = 't';
    *(char *)((long)local_270 + 0x10) = 'e';
    *(char *)((long)local_270 + 0x11) = 'C';
    *(char *)((long)local_270 + 0x12) = 'h';
    *(char *)((long)local_270 + 0x13) = 'a';
    *(char *)((long)local_270 + 0x14) = 'i';
    *(char *)((long)local_270 + 0x15) = 'n';
    local_268 = local_308.file._M_dataplus._M_p;
    local_270->_M_local_buf[(long)local_308.file._M_dataplus._M_p] = '\0';
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2e0 = &local_2d0;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar19) {
      local_2d0._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2d0._8_8_ = plVar11[3];
    }
    else {
      local_2d0._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2d8 = (pointer)plVar11[1];
    *plVar11 = (long)paVar19;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
    local_2b8 = &local_2a8;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == paVar19) {
      local_2a8._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2a8._8_8_ = puVar12[3];
    }
    else {
      local_2a8._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12;
    }
    local_2b0 = (pointer)puVar12[1];
    *puVar12 = paVar19;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_3a0 = &local_390;
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar19) {
      local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_390._8_8_ = plVar11[3];
    }
    else {
      local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_398 = (pointer)plVar11[1];
    *plVar11 = (long)paVar19;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_350.field_2._M_allocated_capacity = *puVar16;
      local_350.field_2._8_8_ = plVar11[3];
    }
    else {
      local_350.field_2._M_allocated_capacity = *puVar16;
      local_350._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_350._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar18 = strchr(pcVar8,0x2c);
    if (pcVar18 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,pcVar8,&local_225);
    }
    else {
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,pcVar8,pcVar18);
    }
    _Var15._M_p = local_328._M_dataplus._M_p;
    if ((pointer)local_328._M_string_length != (pointer)0x0) {
      pcVar18 = (char *)(local_328._M_string_length + (long)local_328._M_dataplus._M_p);
      do {
        _Var4._M_p = local_328._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pcVar18[-1]);
        _Var15._M_p = _Var4._M_p;
        if (iVar7 == 0) break;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar18 + -1);
        uVar17 = (long)paVar19 - (long)_Var4._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_328,uVar17);
        pcVar18 = local_328._M_dataplus._M_p + uVar17;
        _Var15._M_p = local_328._M_dataplus._M_p;
      } while (paVar19 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var4._M_p);
    }
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_378._M_dataplus._M_p = _Var15._M_p;
    if (_Var15._M_p == local_328._M_dataplus._M_p) {
      local_378.field_2._8_8_ = local_328.field_2._8_8_;
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    }
    _Var15._M_p = local_378._M_dataplus._M_p;
    local_378.field_2._M_allocated_capacity = local_328.field_2._M_allocated_capacity;
    local_378._M_string_length = local_328._M_string_length;
    local_328._M_string_length = 0;
    local_328.field_2._M_allocated_capacity =
         local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
    GetTypeName_abi_cxx11_
              (&local_290,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
               (type_info *)local_328._M_dataplus._M_p);
    _Var4._M_p = local_290._M_dataplus._M_p;
    local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_220,local_218 + (long)local_220);
    iVar7 = local_200;
    paVar19 = local_220;
    local_308.line = local_200;
    bVar5 = IsTrue(true);
    if (!bVar5) {
      GTestLog::GTestLog((GTestLog *)&local_248,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar19->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar19->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_248);
    }
    iVar7 = local_200;
    paVar19 = local_220;
    bVar5 = IsTrue(true);
    if (!bVar5) {
      GTestLog::GTestLog((GTestLog *)&local_248,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar19->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar19->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_248);
    }
    pTVar14 = (TestFactoryBase *)operator_new(8);
    pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006dd9a8;
    MakeAndRegisterTestInfo
              (&local_350,_Var15._M_p,_Var4._M_p,(char *)0x0,&local_308,
               &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
      operator_delete(local_308.file._M_dataplus._M_p,
                      local_308.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,(ulong)(local_2d0._M_allocated_capacity + 1));
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,(ulong)(local_260._M_allocated_capacity + 1));
    }
    uVar3 = local_210._M_allocated_capacity;
    if (local_220 == &local_210) {
      local_390._8_8_ = local_210._8_8_;
      local_3a0 = &local_390;
    }
    else {
      local_3a0 = local_220;
    }
    local_390._M_allocated_capacity = local_210._M_allocated_capacity;
    local_398 = local_218;
    local_218 = (pointer)0x0;
    local_210._M_allocated_capacity = local_210._M_allocated_capacity & 0xffffffffffffff00;
    local_380 = local_200;
    local_220 = &local_210;
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,uVar3 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210._M_allocated_capacity + 1);
    }
    local_270 = &local_260;
    if (local_180 == &local_170) {
      local_260._8_8_ = local_170._8_8_;
    }
    else {
      local_270 = local_180;
    }
    local_260._M_allocated_capacity = local_170._M_allocated_capacity;
    local_268 = local_178;
    local_178 = (pointer)0x0;
    local_170._M_allocated_capacity = local_170._M_allocated_capacity & 0xffffffffffffff00;
    local_250 = local_160;
    local_180 = &local_170;
    pcVar8 = strchr(pcVar8,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
    pcVar18 = strchr(pcVar8,0x2c);
    if (pcVar18 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar8,&local_224);
    }
    else {
      local_f8 = (CodeLocation *)local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,pcVar8,pcVar18);
    }
    local_90._0_8_ = local_f8;
    if (local_f0 != 0) {
      puVar24 = (undefined1 *)((long)&(local_f8->file)._M_dataplus._M_p + local_f0);
      do {
        pCVar10 = local_f8;
        iVar7 = isspace((uint)(byte)puVar24[-1]);
        local_90._0_8_ = pCVar10;
        if (iVar7 == 0) break;
        pCVar21 = (CodeLocation *)(puVar24 + -1);
        uVar17 = (long)pCVar21 - (long)pCVar10;
        std::__cxx11::string::_M_erase((ulong)&local_f8,uVar17);
        puVar24 = (undefined1 *)(uVar17 + (long)local_f8);
        local_90._0_8_ = local_f8;
      } while (pCVar21 != pCVar10);
    }
    local_1d8 = (CodeLocation *)(local_90 + 0x10);
    local_f8 = (CodeLocation *)local_e8;
    if ((CodeLocation *)local_90._0_8_ == local_f8) {
      uStack_78 = local_e8._8_8_;
      local_90._0_8_ = local_1d8;
    }
    uStack_7f = local_e8._1_7_;
    local_90[0x10] = local_e8[0];
    local_90._8_8_ = local_f0;
    local_f0 = 0;
    local_e8[0] = 0;
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                   (key_type *)local_90);
    iVar7 = 0x6f4130;
    if (cVar9._M_node !=
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10))
    {
      pCVar10 = TypedTestSuitePState::GetCodeLocation
                          ((TypedTestSuitePState *)
                           bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                           (string *)local_90);
      local_2b8 = &local_2a8;
      pcVar2 = (pCVar10->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
      local_298 = pCVar10->line;
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      local_308.file._M_dataplus._M_p = (pointer)0x16;
      local_328._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_308);
      local_328.field_2._M_allocated_capacity = (size_type)local_308.file._M_dataplus._M_p;
      *(undefined8 *)local_328._M_dataplus._M_p = 0x6543796669726556;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 8) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 9) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 10) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0xb) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0xc) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0xd) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0xf) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0xf) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0x10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0x11) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0x12) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0x13) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0x14) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p + 0x15) = 'n';
      local_328._M_string_length = (size_type)local_308.file._M_dataplus._M_p;
      local_328._M_dataplus._M_p[(long)local_308.file._M_dataplus._M_p] = '\0';
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_328);
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar19) {
        local_378.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_378.field_2._8_8_ = plVar11[3];
      }
      else {
        local_378.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_378._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_378._M_string_length = plVar11[1];
      *plVar11 = (long)paVar19;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_2e0 = &local_2d0;
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar19) {
        local_2d0._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_2d0._8_8_ = plVar11[3];
      }
      else {
        local_2d0._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11;
      }
      local_2d8 = (pointer)plVar11[1];
      *plVar11 = (long)paVar19;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      local_3a0 = &local_390;
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar19) {
        local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_390._8_8_ = plVar11[3];
      }
      else {
        local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11;
      }
      local_398 = (pointer)plVar11[1];
      *plVar11 = (long)paVar19;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_350.field_2._M_allocated_capacity = *puVar16;
        local_350.field_2._8_8_ = plVar11[3];
      }
      else {
        local_350.field_2._M_allocated_capacity = *puVar16;
        local_350._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_350._M_string_length = plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pcVar18 = strchr(pcVar8,0x2c);
      if (pcVar18 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar8,&local_223);
      }
      else {
        local_248 = &local_238;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,pcVar8,pcVar18);
      }
      local_290._M_dataplus._M_p = (pointer)local_248;
      if (local_240 != (pointer)0x0) {
        ptVar22 = (type_info *)(local_248->_M_local_buf + (long)local_240);
        do {
          paVar19 = local_248;
          iVar7 = isspace((uint)(byte)ptVar22[-1]);
          local_290._M_dataplus._M_p = (pointer)paVar19;
          if (iVar7 == 0) break;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar22 + -1);
          uVar17 = (long)paVar23 - (long)paVar19;
          std::__cxx11::string::_M_erase((ulong)&local_248,uVar17);
          ptVar22 = (type_info *)(local_248->_M_local_buf + uVar17);
          local_290._M_dataplus._M_p = (pointer)local_248;
        } while (paVar23 != paVar19);
      }
      local_248 = &local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == local_248) {
        local_290.field_2._8_8_ = local_238._8_8_;
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      _Var15._M_p = local_290._M_dataplus._M_p;
      local_290.field_2._M_allocated_capacity = local_238._M_allocated_capacity;
      local_290._M_string_length = (size_type)local_240;
      local_240 = (pointer)0x0;
      local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
      GetTypeName_abi_cxx11_
                (&local_1a0,
                 (internal *)
                 &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
                 (type_info *)local_248->_M_local_buf);
      _Var4._M_p = local_1a0._M_dataplus._M_p;
      local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,local_2b8,local_2b0 + (long)local_2b8);
      iVar7 = local_298;
      paVar19 = local_2b8;
      local_308.line = local_298;
      bVar5 = IsTrue(true);
      if (!bVar5) {
        GTestLog::GTestLog((GTestLog *)&local_1f8,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                   ,0x6a);
        if (paVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
        }
        else {
          sVar13 = strlen(paVar19->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar19->_M_local_buf,sVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_1f8);
      }
      iVar7 = local_298;
      paVar19 = local_2b8;
      bVar5 = IsTrue(true);
      if (!bVar5) {
        GTestLog::GTestLog((GTestLog *)&local_1f8,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                   ,0x6f);
        if (paVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
        }
        else {
          sVar13 = strlen(paVar19->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar19->_M_local_buf,sVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_1f8);
      }
      pTVar14 = (TestFactoryBase *)operator_new(8);
      pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006dda70;
      MakeAndRegisterTestInfo
                (&local_350,_Var15._M_p,_Var4._M_p,(char *)0x0,&local_308,
                 &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
        operator_delete(local_308.file._M_dataplus._M_p,
                        local_308.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,
                        (ulong)(local_378.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,
                        (ulong)(local_328.field_2._M_allocated_capacity + 1));
      }
      uVar3 = local_2a8._M_allocated_capacity;
      if (local_2b8 == &local_2a8) {
        local_390._8_8_ = local_2a8._8_8_;
        local_3a0 = &local_390;
      }
      else {
        local_3a0 = local_2b8;
      }
      local_390._M_allocated_capacity = local_2a8._M_allocated_capacity;
      local_398 = local_2b0;
      local_2b0 = (pointer)0x0;
      local_2a8._M_allocated_capacity = local_2a8._M_allocated_capacity & 0xffffffffffffff00;
      local_380 = local_298;
      local_2b8 = &local_2a8;
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,uVar3 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
      }
      local_2e0 = &local_2d0;
      if (local_270 == &local_260) {
        local_2d0._8_8_ = local_260._8_8_;
      }
      else {
        local_2e0 = local_270;
      }
      local_2d0._M_allocated_capacity = local_260._M_allocated_capacity;
      local_2d8 = local_268;
      local_268 = (pointer)0x0;
      local_260._M_allocated_capacity = local_260._M_allocated_capacity & 0xffffffffffffff00;
      local_2c0 = local_250;
      local_270 = &local_260;
      pcVar8 = strchr(pcVar8,0x2c);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        do {
          pbVar1 = (byte *)(pcVar8 + 1);
          pcVar8 = pcVar8 + 1;
          iVar7 = isspace((uint)*pbVar1);
        } while (iVar7 != 0);
      }
      RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
      pcVar18 = strchr(pcVar8,0x2c);
      if (pcVar18 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_e8 + 0x10),pcVar8,&local_222);
      }
      else {
        local_d8._M_allocated_capacity = (size_type)(local_e8 + 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x10),pcVar8,pcVar18);
      }
      local_70._M_allocated_capacity = local_d8._M_allocated_capacity;
      if (local_d8._8_8_ != 0) {
        pcVar18 = (char *)(local_d8._8_8_ + local_d8._M_allocated_capacity);
        do {
          uVar3 = local_d8._M_allocated_capacity;
          iVar7 = isspace((uint)(byte)pcVar18[-1]);
          local_70._M_allocated_capacity = uVar3;
          if (iVar7 == 0) break;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar18 + -1);
          uVar17 = (long)paVar19 - uVar3;
          std::__cxx11::string::_M_erase((ulong)(local_e8 + 0x10),uVar17);
          pcVar18 = (char *)(uVar17 + local_d8._M_allocated_capacity);
          local_70._M_allocated_capacity = local_d8._M_allocated_capacity;
        } while (paVar19 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar3);
      }
      local_b8 = &local_60;
      local_d8._M_allocated_capacity = (size_type)(local_e8 + 0x20);
      if (local_70._M_allocated_capacity == local_d8._M_allocated_capacity) {
        local_60._8_8_ = local_c8._8_8_;
        local_70._M_allocated_capacity = (size_type)local_b8;
      }
      local_60._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
      local_60._M_local_buf[0] = local_c8._M_local_buf[0];
      local_70._8_8_ = local_d8._8_8_;
      local_d8._8_8_ = 0;
      local_c8._M_local_buf[0] = 0;
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                      *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8)
                     ,(key_type *)&local_70);
      iVar7 = 0x6f4130;
      if (cVar9._M_node !=
          (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10)
         ) {
        pCVar10 = TypedTestSuitePState::GetCodeLocation
                            ((TypedTestSuitePState *)
                             bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                             (string *)&local_70);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        pcVar2 = (pCVar10->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
        local_330 = pCVar10->line;
        local_248 = &local_238;
        local_308.file._M_dataplus._M_p = (pointer)0x16;
        local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)&local_308);
        local_238._M_allocated_capacity = (size_type)local_308.file._M_dataplus._M_p;
        local_248->_M_allocated_capacity = 0x6543796669726556;
        *(char *)((long)local_248 + 8) = 'r';
        *(char *)((long)local_248 + 9) = 't';
        *(char *)((long)local_248 + 10) = 'i';
        *(char *)((long)local_248 + 0xb) = 'f';
        *(char *)((long)local_248 + 0xc) = 'i';
        *(char *)((long)local_248 + 0xd) = 'c';
        *(char *)((long)local_248 + 0xe) = 'a';
        *(char *)((long)local_248 + 0xf) = 't';
        *(char *)((long)local_248 + 0xe) = 'a';
        *(char *)((long)local_248 + 0xf) = 't';
        *(char *)((long)local_248 + 0x10) = 'e';
        *(char *)((long)local_248 + 0x11) = 'C';
        *(char *)((long)local_248 + 0x12) = 'h';
        *(char *)((long)local_248 + 0x13) = 'a';
        *(char *)((long)local_248 + 0x14) = 'i';
        *(char *)((long)local_248 + 0x15) = 'n';
        local_240 = local_308.file._M_dataplus._M_p;
        local_248->_M_local_buf[(long)local_308.file._M_dataplus._M_p] = '\0';
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar19) {
          local_290.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_290.field_2._8_8_ = plVar11[3];
        }
        else {
          local_290.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_290._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_290._M_string_length = plVar11[1];
        *plVar11 = (long)paVar19;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar19) {
          local_328.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_328.field_2._8_8_ = plVar11[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_328._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_328._M_string_length = plVar11[1];
        *plVar11 = (long)paVar19;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_328);
        local_3a0 = &local_390;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar19) {
          local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_390._8_8_ = plVar11[3];
        }
        else {
          local_390._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11;
        }
        local_398 = (pointer)plVar11[1];
        *plVar11 = (long)paVar19;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar19) {
          local_378.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_378.field_2._8_8_ = plVar11[3];
        }
        else {
          local_378.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_378._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_378._M_string_length = plVar11[1];
        *plVar11 = (long)paVar19;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        pcVar18 = strchr(pcVar8,0x2c);
        if (pcVar18 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pcVar8,&local_221)
          ;
          ptVar22 = extraout_RDX_00;
        }
        else {
          local_1f8 = &local_1e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar8,pcVar18);
          ptVar22 = extraout_RDX;
        }
        local_1a0._M_dataplus._M_p = (pointer)local_1f8;
        if (local_1f0 != 0) {
          pcVar8 = local_1f8->_M_local_buf + local_1f0;
          do {
            paVar19 = local_1f8;
            iVar7 = isspace((uint)(byte)pcVar8[-1]);
            local_1a0._M_dataplus._M_p = (pointer)paVar19;
            ptVar22 = extraout_RDX_01;
            if (iVar7 == 0) break;
            pcVar18 = pcVar8 + -1;
            uVar17 = (long)pcVar18 - (long)paVar19;
            std::__cxx11::string::_M_erase((ulong)&local_1f8,uVar17);
            pcVar8 = local_1f8->_M_local_buf + uVar17;
            local_1a0._M_dataplus._M_p = (pointer)local_1f8;
            ptVar22 = extraout_RDX_02;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar18 != paVar19);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p == &local_1e8) {
          local_1a0.field_2._8_8_ = local_1e8._8_8_;
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        }
        _Var4._M_p = local_1a0._M_dataplus._M_p;
        local_1a0.field_2._M_allocated_capacity._1_7_ = local_1e8._M_allocated_capacity._1_7_;
        local_1a0.field_2._M_local_buf[0] = local_1e8._M_local_buf[0];
        local_1a0._M_string_length = local_1f0;
        local_1f0 = 0;
        local_1e8._M_local_buf[0] = '\0';
        local_1f8 = &local_1e8;
        GetTypeName_abi_cxx11_
                  (&local_50,
                   (internal *)
                   &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
                   ptVar22);
        type_param._M_p = local_50._M_dataplus._M_p;
        local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_350._M_dataplus._M_p,
                   local_350._M_dataplus._M_p + local_350._M_string_length);
        iVar7 = local_330;
        _Var15._M_p = local_350._M_dataplus._M_p;
        local_308.line = local_330;
        bVar5 = IsTrue(true);
        if (!bVar5) {
          GTestLog::GTestLog(&local_354,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                     ,0x6a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var15._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
          }
          else {
            sVar13 = strlen(_Var15._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var15._M_p,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_354);
        }
        iVar7 = local_330;
        _Var15._M_p = local_350._M_dataplus._M_p;
        bVar5 = IsTrue(true);
        if (!bVar5) {
          GTestLog::GTestLog(&local_354,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                     ,0x6f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var15._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
          }
          else {
            sVar13 = strlen(_Var15._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var15._M_p,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_354);
        }
        pTVar14 = (TestFactoryBase *)operator_new(8);
        pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006ddb38;
        MakeAndRegisterTestInfo
                  (&local_378,_Var4._M_p,type_param._M_p,(char *)0x0,&local_308,
                   &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
          operator_delete(local_308.file._M_dataplus._M_p,
                          local_308.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,
                          CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,(ulong)(local_238._M_allocated_capacity + 1));
        }
        uVar3 = local_350.field_2._M_allocated_capacity;
        paVar19 = &local_350.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p == paVar19) {
          local_390._8_8_ = local_350.field_2._8_8_;
          local_3a0 = &local_390;
        }
        else {
          local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p;
        }
        local_390._M_allocated_capacity = local_350.field_2._M_allocated_capacity;
        local_398 = (pointer)local_350._M_string_length;
        local_350._M_string_length = 0;
        local_350.field_2._M_allocated_capacity =
             local_350.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_380 = local_330;
        local_350._M_dataplus._M_p = (pointer)paVar19;
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,uVar3 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_allocated_capacity != &local_60) {
          operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1)
          ;
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,(ulong)(local_2d0._M_allocated_capacity + 1));
        }
        if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,stack0xffffffffffffff80 + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,(ulong)(local_260._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        paVar19 = &local_170;
        if (local_180 != paVar19) {
          operator_delete(local_180,(ulong)(local_170._M_allocated_capacity + 1));
          paVar19 = extraout_RAX;
        }
        uVar6 = SUB81(paVar19,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          uVar6 = extraout_AL;
        }
        return (bool)uVar6;
      }
      goto LAB_0040618e;
    }
  }
  FormatFileLocation_abi_cxx11_
            (&local_308.file,(internal *)local_270->_M_local_buf,(char *)(ulong)local_250,iVar7);
  TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
  ::Register();
LAB_0040618e:
  FormatFileLocation_abi_cxx11_
            (&local_308.file,(internal *)local_2e0->_M_local_buf,(char *)(ulong)local_2c0,iVar7);
  TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
  ::Register();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,(ulong)(local_378.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,(ulong)(local_328.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,local_b8->_M_allocated_capacity + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,(ulong)(local_2d0._M_allocated_capacity + 1));
  }
  if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,(ulong)((local_1d8->file)._M_dataplus._M_p + 1));
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,(ulong)(local_260._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,(ulong)(local_170._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }